

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall sfc::Image::Image(Image *this,Palette *palette)

{
  channel_vec_t *this_00;
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  void *pvVar4;
  runtime_error *this_01;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  void *pvVar11;
  uint uVar12;
  rgba_vec_t rgba_v;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  v;
  value_type vy;
  rgba_vec_t local_98;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  _Base_ptr local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  this_00 = &this->_data;
  local_68 = &(this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indexed_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_palette).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_68;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_68;
  (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Palette::normalized_colors(&local_80,palette);
  if ((local_80.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_80.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (((local_80.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      ((local_80.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    uVar12 = palette->_max_colors_per_subpalette;
    this->_width = uVar12;
    uVar10 = (int)((ulong)((long)local_80.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_80.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    this->_height = uVar10;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(ulong)(uVar10 * uVar12 * 4));
    puVar2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar3 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      memset(puVar2,0,(long)puVar3 - (long)puVar2);
    }
    if (local_80.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_80.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar9 = 0;
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
                   local_80.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar9);
        pvVar4 = (void *)CONCAT44(local_60._M_impl.super__Rb_tree_header._M_header._4_4_,
                                  local_60._M_impl.super__Rb_tree_header._M_header._M_color);
        pvVar11 = (void *)local_60._M_impl._0_8_;
        if (pvVar4 != (void *)local_60._M_impl._0_8_) {
          uVar12 = 1;
          uVar6 = 0;
          do {
            uVar10 = *(uint *)((long)pvVar11 + uVar6 * 4);
            if ((int)uVar10 < 0) {
              uVar8 = uVar10 & 0xffffff00;
              uVar7 = uVar10 & 0xffff0000;
              uVar5 = uVar10 & 0xff000000;
            }
            else {
              uVar5 = 0;
              uVar7 = 0;
              uVar8 = 0;
              uVar10 = 0;
            }
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ =
                 uVar10 & 0xff | uVar8 & 0xff00 | uVar7 & 0xff0000 | uVar5;
            uVar6 = (ulong)((this->_width * (int)uVar9 + uVar12) * 4 - 4);
            puVar2 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar6 + 3 <=
                (ulong)((long)(this->_data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
              puVar2[uVar6] = (uchar)uVar10;
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6 + 1] = (uchar)(uVar8 >> 8);
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6 + 2] = (uchar)(uVar7 >> 0x10);
              (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar6 + 3] = (uchar)(uVar5 >> 0x18);
              std::
              _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              ::_M_insert_unique<unsigned_int_const&>
                        ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)&this->_colors,(uint *)&local_98);
              pvVar4 = (void *)CONCAT44(local_60._M_impl.super__Rb_tree_header._M_header._4_4_,
                                        local_60._M_impl.super__Rb_tree_header._M_header._M_color);
              pvVar11 = (void *)local_60._M_impl._0_8_;
            }
            uVar6 = (ulong)uVar12;
            uVar12 = uVar12 + 1;
          } while (uVar6 < (ulong)((long)pvVar4 - (long)pvVar11 >> 2));
        }
        if (pvVar11 != (void *)0x0) {
          operator_delete(pvVar11,(long)local_60._M_impl.super__Rb_tree_header._M_header._M_parent -
                                  (long)pvVar11);
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        uVar6 = ((long)local_80.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_80.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
    }
    this->_src_coord_x = 0;
    this->_src_coord_y = 0;
    to_rgba(&local_98,this_00);
    __first._M_current._4_4_ =
         local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_;
    __first._M_current._0_4_ =
         (uint)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_60,
               __first,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(this->_colors)._M_t);
    if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_60._M_impl.super__Rb_tree_header._M_header._M_color;
      (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = local_68;
      (this->_colors)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_60._M_impl.super__Rb_tree_header._M_node_count;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_60);
    pvVar4 = (void *)CONCAT44(local_98.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)local_98.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_98.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4)
      ;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_80);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"No colors");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Image::Image(const sfc::Palette& palette) {
  auto v = palette.normalized_colors();
  if (v.empty() || v[0].empty())
    throw std::runtime_error("No colors");

  _width = palette.max_colors_per_subpalette();
  _height = (unsigned)v.size();
  _data.resize(_width * _height * 4);
  std::fill(_data.begin(), _data.end(), 0);

  for (unsigned y = 0; y < v.size(); ++y) {
    auto vy = v[y];
    for (unsigned x = 0; x < vy.size(); ++x)
      set_pixel(sfc::rgba_color(vy[x]), x, y);
  }

  _src_coord_x = _src_coord_y = 0;

  auto rgba_v = rgba_data();
  _colors = rgba_set_t(rgba_v.begin(), rgba_v.end());
}